

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool art_node_iterator_lower_bound(art_ref_t ref,art_iterator_t *iterator,art_key_chunk_t *key)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  size_t i;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  art_typecode_t typecode;
  ulong ref_00;
  long lVar11;
  
  do {
    if ((ref & 0xff) == 1) {
      iVar6 = art_compare_keys((art_key_chunk_t *)
                               ((ref >> 0xc & 0xfffffffffffffff0) + (long)iterator->art->nodes[1]),
                               key);
      if (-1 < iVar6) {
        art_iterator_valid_loc(iterator,ref);
        return true;
      }
      goto LAB_00105a19;
    }
    uVar9 = (ulong)(uint)((int)(ref & 0xff) << 3);
    lVar4 = *(long *)((long)iterator->art->nodes + uVar9);
    lVar11 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar9);
    lVar1 = lVar4 + lVar11;
    bVar2 = iterator->depth;
    uVar9 = (ulong)*(byte *)(lVar4 + lVar11);
    iVar6 = memcmp((byte *)(lVar4 + lVar11) + 1,key + bVar2,uVar9);
    if (iVar6 < 0) goto LAB_00105a19;
    ref_00 = ref;
    if (iVar6 != 0) break;
    uVar7 = (uint)ref & 0xff;
    if (3 < uVar7 - 2) goto LAB_00105a19;
    bVar2 = (key + bVar2)[uVar9];
    uVar9 = (ulong)bVar2;
    switch(uVar7) {
    case 2:
      uVar9 = 0;
      while( true ) {
        if (*(byte *)(lVar1 + 6) == uVar9) goto LAB_00105a19;
        bVar3 = *(byte *)(lVar1 + 7 + uVar9);
        if (bVar2 <= bVar3) break;
        uVar9 = uVar9 + 1;
      }
      ref_00 = *(ulong *)(lVar1 + 0x10 + uVar9 * 8);
      goto LAB_001059ce;
    case 3:
      uVar9 = 0;
      while( true ) {
        if (*(byte *)(lVar1 + 6) == uVar9) goto LAB_00105a19;
        bVar3 = *(byte *)(lVar1 + 7 + uVar9);
        if (bVar2 <= bVar3) break;
        uVar9 = uVar9 + 1;
      }
      ref_00 = *(ulong *)(lVar1 + 0x18 + uVar9 * 8);
LAB_001059ce:
      lVar10 = (ulong)bVar3 * 0x100 + uVar9;
      break;
    case 4:
      lVar10 = uVar9 * 0x101;
      pbVar8 = (byte *)(lVar4 + lVar11 + uVar9 + 0x10);
      while( true ) {
        if (lVar10 == 0x10100) goto LAB_00105a19;
        if ((ulong)*pbVar8 != 0x30) break;
        lVar10 = lVar10 + 0x101;
        pbVar8 = pbVar8 + 1;
      }
      ref_00 = *(ulong *)(lVar1 + 0x110 + (ulong)*pbVar8 * 8);
      break;
    case 5:
      for (; uVar9 != 0x100; uVar9 = uVar9 + 1) {
        ref_00 = *(ulong *)(lVar1 + 8 + uVar9 * 8);
        if (ref_00 != 0) goto LAB_001059af;
      }
      ref_00 = 0;
      uVar9 = 0;
LAB_001059af:
      lVar10 = uVar9 * 0x101;
    }
    if (ref_00 == 0) {
LAB_00105a19:
      _Var5 = art_iterator_up_and_move(iterator,true);
      return _Var5;
    }
    art_iterator_down(iterator,ref,(uint8_t)lVar10);
    ref = ref_00;
  } while (((uint)((ulong)lVar10 >> 8) & 0xff) <= (uint)bVar2);
  art_node_init_iterator(ref_00,iterator,true);
  return true;
}

Assistant:

static bool art_node_iterator_lower_bound(art_ref_t ref,
                                          art_iterator_t *iterator,
                                          const art_key_chunk_t key[]) {
    while (!art_is_leaf(ref)) {
        art_inner_node_t *inner_node =
            (art_inner_node_t *)art_deref(iterator->art, ref);
        int prefix_comparison =
            art_compare_prefix(inner_node->prefix, 0, key, iterator->depth,
                               inner_node->prefix_size);
        if (prefix_comparison < 0) {
            // Prefix so far has been equal, but we've found a smaller key.
            // Since we take the lower bound within each node, we can return
            // the next leaf.
            return art_iterator_up_and_move(iterator, true);
        } else if (prefix_comparison > 0) {
            // No key equal to the key we're looking for, return the first
            // leaf.
            return art_node_init_iterator(ref, iterator, true);
        }
        // Prefix is equal, move to lower bound child.
        art_key_chunk_t key_chunk =
            key[iterator->depth + inner_node->prefix_size];
        art_indexed_child_t indexed_child = art_node_lower_bound(
            (art_node_t *)inner_node, art_ref_typecode(ref), key_chunk);
        if (indexed_child.child == CROARING_ART_NULL_REF) {
            // Only smaller keys among children.
            return art_iterator_up_and_move(iterator, true);
        }
        if (indexed_child.key_chunk > key_chunk) {
            // Only larger children, return the first larger child.
            art_iterator_down(iterator, ref, indexed_child.index);
            return art_node_init_iterator(indexed_child.child, iterator, true);
        }
        // We found a child with an equal prefix.
        art_iterator_down(iterator, ref, indexed_child.index);
        ref = indexed_child.child;
    }
    art_leaf_t *leaf = (art_leaf_t *)art_deref(iterator->art, ref);
    if (art_compare_keys(leaf->key, key) >= 0) {
        // Leaf has an equal or larger key.
        return art_iterator_valid_loc(iterator, ref);
    }
    // Leaf has an equal prefix, but the full key is smaller. Move to the
    // next leaf.
    return art_iterator_up_and_move(iterator, true);
}